

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t roaring_bitmap_shrink_to_fit(roaring_bitmap_t *r)

{
  int iVar1;
  container_t *c_00;
  container_t *c;
  uint8_t type_original;
  long lStack_18;
  int i;
  size_t answer;
  roaring_bitmap_t *r_local;
  
  lStack_18 = 0;
  answer = (size_t)r;
  for (c._4_4_ = 0; c._4_4_ < *(int *)answer; c._4_4_ = c._4_4_ + 1) {
    c_00 = ra_get_container_at_index
                     ((roaring_array_t *)answer,(uint16_t)c._4_4_,(uint8_t *)((long)&c + 3));
    iVar1 = container_shrink_to_fit(c_00,c._3_1_);
    lStack_18 = iVar1 + lStack_18;
  }
  iVar1 = ra_shrink_to_fit((roaring_array_t *)answer);
  return iVar1 + lStack_18;
}

Assistant:

size_t roaring_bitmap_shrink_to_fit(roaring_bitmap_t *r) {
    size_t answer = 0;
    for (int i = 0; i < r->high_low_container.size; i++) {
        uint8_t type_original;
        container_t *c = ra_get_container_at_index(&r->high_low_container, i,
                                                   &type_original);
        answer += container_shrink_to_fit(c, type_original);
    }
    answer += ra_shrink_to_fit(&r->high_low_container);
    return answer;
}